

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
libcellml::Units::unitAttributes
          (Units *this,string *reference,string *prefix,double *exponent,double *multiplier,
          string *id)

{
  const_iterator cVar1;
  string dummyReference;
  
  dummyReference._M_dataplus._M_p = (pointer)&dummyReference.field_2;
  dummyReference._M_string_length = 0;
  dummyReference.field_2._M_local_buf[0] = '\0';
  cVar1 = UnitsImpl::findUnit((UnitsImpl *)
                              (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
                              reference);
  unitAttributes(this,(long)((long)cVar1._M_current -
                            (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].
                            mId.field_2._M_allocated_capacity) / 0x70,&dummyReference,prefix,
                 exponent,multiplier,id);
  std::__cxx11::string::~string((string *)&dummyReference);
  return;
}

Assistant:

void Units::unitAttributes(const std::string &reference, std::string &prefix, double &exponent, double &multiplier, std::string &id) const
{
    std::string dummyReference;
    unitAttributes(static_cast<size_t>(pFunc()->findUnit(reference) - pFunc()->mUnitDefinitions.begin()), dummyReference, prefix, exponent, multiplier, id);
}